

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFOpcPackage.cpp
# Opt level: O1

void __thiscall
Assimp::D3MF::OpcPackageRelationshipReader::ParseRootNode
          (OpcPackageRelationshipReader *this,XmlReader *xmlReader)

{
  char cVar1;
  int iVar2;
  
  iVar2 = (*xmlReader->_vptr_IIrrXMLReader[2])(xmlReader);
  cVar1 = (char)iVar2;
  while (cVar1 != '\0') {
    iVar2 = (*xmlReader->_vptr_IIrrXMLReader[3])(xmlReader);
    if (iVar2 == 1) {
      (*xmlReader->_vptr_IIrrXMLReader[0xd])(xmlReader);
      iVar2 = std::__cxx11::string::compare(XmlTag::RELS_RELATIONSHIP_NODE_abi_cxx11_);
      if (iVar2 == 0) {
        ParseChildNode(this,xmlReader);
      }
    }
    iVar2 = (*xmlReader->_vptr_IIrrXMLReader[2])(xmlReader);
    cVar1 = (char)iVar2;
  }
  return;
}

Assistant:

void ParseRootNode(XmlReader* xmlReader)
    {       
        ParseAttributes(xmlReader);

        while(xmlReader->read())
        {
            if(xmlReader->getNodeType() == irr::io::EXN_ELEMENT &&
               xmlReader->getNodeName() == XmlTag::RELS_RELATIONSHIP_NODE)
            {
                ParseChildNode(xmlReader);
            }
        }
    }